

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brightness_ctrl.cpp
# Opt level: O1

void __thiscall BrightnessControl::_brightness_slide(BrightnessControl *this,int p)

{
  uint v;
  int iVar1;
  int *piVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double local_58;
  timespec local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->adjust_m);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar3 = p + this->offset;
  iVar1 = 100;
  if (iVar3 < 100) {
    iVar1 = iVar3;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  v = (iVar1 * this->maxbr) / 100;
  if ((int)v <= this->minabr) {
    v = this->minabr;
  }
  fprintf(_stderr,"%c: brightness adjust: %d->%d/%d\n",0x49,(ulong)(uint)this->br,(ulong)v);
  iVar1 = this->br;
  dVar4 = (double)(int)((uint)(iVar1 <= (int)v) * 2 + -1);
  local_58 = 1.0;
  do {
    iVar3 = this->br;
    if ((int)v < iVar1) {
      dVar5 = round(local_58 * dVar4);
      if (dVar5 + (double)iVar3 < (double)(int)v) goto LAB_00109f9f;
    }
    else {
      dVar5 = round(local_58);
      if ((double)(int)v < dVar5 + (double)iVar3) {
LAB_00109f9f:
        this->br = v;
        writeint((this->brpath)._M_pathname._M_dataplus._M_p,v);
        pthread_mutex_unlock((pthread_mutex_t *)&this->adjust_m);
        return;
      }
    }
    dVar5 = round(local_58 * dVar4);
    iVar3 = (int)dVar5 + this->br;
    this->br = iVar3;
    writeint((this->brpath)._M_pathname._M_dataplus._M_p,iVar3);
    local_38.tv_sec = 0;
    local_38.tv_nsec = 10000000;
    do {
      iVar3 = nanosleep(&local_38,&local_38);
      if (iVar3 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    local_58 = local_58 * 1.2;
  } while( true );
}

Assistant:

void BrightnessControl::_brightness_slide(int p)
{
	std::lock_guard<std::mutex> adjust_lck(adjust_m);
	p+=offset;
	if(p>100)p=100;
	if(p<0)p=0;
	int pbr=maxbr*p/100;
	if(pbr<minabr)pbr=minabr;
	LOG('I',"brightness adjust: %d->%d/%d",br,pbr,maxbr);
	int d=1;if(pbr<br)d=-1;double dd=1;
	while(d>0&&br+round(d*dd)<=pbr||d<0&&br+round(d*dd)>=pbr)
	{
		br+=(int)round(d*dd);writeint(brpath.c_str(),br);
		dd=dd*1.2;std::this_thread::sleep_for(std::chrono::milliseconds(10));
	}
	br=pbr;writeint(brpath.c_str(),br);
}